

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long row;
  double dVar1;
  double dVar2;
  double *pdVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong row_00;
  int j;
  ulong row_01;
  TPZFNMatrix<20,_double> phi0;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFNMatrix<20,_double> phi1;
  
  if (1 < order) {
    uVar4 = order - 1;
    uVar5 = (ulong)(uVar4 * uVar4);
    if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar5) ||
       ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (phi,uVar5,1);
    }
    if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < (long)uVar5)) {
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
                (dphi,2,uVar5);
    }
    row_00 = (ulong)uVar4;
    TPZFNMatrix<20,_double>::TPZFNMatrix(&phi0,row_00,1);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&phi1,row_00,1);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&dphi0,1,row_00);
    TPZFNMatrix<20,_double>::TPZFNMatrix(&dphi1,1,row_00);
    (*(code *)TPZShapeLinear::fOrthogonal)(*x->fStore,uVar4,&phi0,&dphi0);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[1],uVar4,&phi1,&dphi1);
    lVar6 = 0;
    for (uVar5 = 0; uVar5 != row_00; uVar5 = uVar5 + 1) {
      for (row_01 = 0; row_00 != row_01; row_01 = row_01 + 1) {
        pdVar3 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,uVar5,0);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_01,0);
        row = lVar6 + row_01;
        dVar2 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(phi,row,0);
        *pdVar3 = dVar1 * dVar2;
        pdVar3 = TPZFMatrix<double>::operator()(&dphi0.super_TPZFMatrix<double>,0,uVar5);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(&phi1.super_TPZFMatrix<double>,row_01,0);
        dVar2 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(dphi,0,row);
        *pdVar3 = dVar1 * dVar2;
        pdVar3 = TPZFMatrix<double>::operator()(&phi0.super_TPZFMatrix<double>,uVar5,0);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(&dphi1.super_TPZFMatrix<double>,0,row_01);
        dVar2 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()(dphi,1,row);
        *pdVar3 = dVar1 * dVar2;
      }
      lVar6 = lVar6 + row_00;
    }
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&dphi1);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&dphi0);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&phi1);
    TPZFNMatrix<20,_double>::~TPZFNMatrix(&phi0);
  }
  return;
}

Assistant:

void TPZShapeQuad::ShapeInternal(TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        
        if((order-2) < 0) return;
        int ord1 = order - 1;
        int numshape = (order-1)*(order-1);
        if(numshape > phi.Rows() || phi.Cols() < 1) phi.Resize(numshape,1);
        if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
        TPZFNMatrix<20, REAL> phi0(ord1,1),phi1(ord1,1),dphi0(1,ord1),dphi1(1,ord1);
        TPZShapeLinear::fOrthogonal(x[0],ord1,phi0,dphi0);
        TPZShapeLinear::fOrthogonal(x[1],ord1,phi1,dphi1);
        for (int i=0;i<ord1;i++) {
            for (int j=0;j<ord1;j++) {
                int index = i*ord1+j;
                phi(index,0) =  phi0(i,0)* phi1(j,0);
                dphi(0,index) = dphi0(0,i)* phi1(j,0);
                dphi(1,index) =  phi0(i,0)*dphi1(0,j);
            }
        }
      
    }